

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

bool __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldExtractUint::test
          (ShaderBitfieldOperationCaseBitfieldExtractUint *this,Data *data)

{
  GLuint *pGVar1;
  GLuint *pGVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  byte bVar6;
  long lVar7;
  uint uVar8;
  
  iVar3 = this->m_components;
  bVar4 = iVar3 < 1;
  if (0 < iVar3) {
    uVar8 = ~(-1 << ((byte)data->bits & 0x1f));
    if (data->bits == 0x20) {
      uVar8 = 0xffffffff;
    }
    bVar6 = (byte)data->offset;
    if (data->outUvec4[0] == (data->inUvec4[0] >> (bVar6 & 0x1f) & uVar8)) {
      lVar7 = 1;
      do {
        iVar5 = (int)lVar7;
        if (iVar3 == iVar5) break;
        pGVar1 = data->inUvec4 + lVar7;
        pGVar2 = data->outUvec4 + lVar7;
        lVar7 = lVar7 + 1;
      } while (*pGVar2 == (*pGVar1 >> (bVar6 & 0x1f) & uVar8));
      bVar4 = iVar3 <= iVar5;
    }
  }
  return bVar4;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint expected =
				(data->inUvec4[i] >> data->offset) & (data->bits == 32 ? 0xFFFFFFFF : ((1 << data->bits) - 1));
			if (data->outUvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}